

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintKTX2InfoTextForNamedFile(char *filename)

{
  FILE *__stream;
  char *in_RDI;
  ktx_error_code_e result;
  FILE *file;
  FILE *in_stack_00000048;
  ktx_error_code_e local_4;
  
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = KTX_FILE_OPEN_FAILED;
  }
  else {
    local_4 = ktxPrintKTX2InfoTextForStdioStream(in_stack_00000048);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForNamedFile(const char* const filename)
{
    FILE* file = NULL;

#ifdef _WIN32
    fopen_s(&file, filename, "rb");
#else
    file = fopen(filename, "rb");
#endif

    if (!file)
        return KTX_FILE_OPEN_FAILED;

    KTX_error_code result = ktxPrintKTX2InfoTextForStdioStream(file);

    fclose(file);
    return result;
}